

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O1

void __thiscall assembler::VirtualChannel::VirtualChannel(VirtualChannel *this,int id)

{
  _Rb_tree_header *p_Var1;
  
  this->id_ = id;
  this->n_ = -1;
  (this->tpdu_)._M_t.
  super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>._M_t
  .super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>.
  super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
  p_Var1 = &(this->apidSeq_)._M_t._M_impl.super__Rb_tree_header;
  (this->apidSeq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->apidSeq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->apidSeq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->apidSeq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->apidSeq_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header;
  (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

VirtualChannel::VirtualChannel(int id)
  : id_(id), n_(-1) {
}